

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODTree.cpp
# Opt level: O2

void __thiscall
RandomForest::ODTree<double>::MultipleParameterBoostrapSampling
          (ODTree<double> *this,int oldNs,
          shared_ptr<std::vector<int,_std::allocator<int>_>_> *o_list)

{
  element_type *peVar1;
  element_type *peVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  vector<int,std::allocator<int>> *pvVar7;
  bool bVar8;
  vector<int,_std::allocator<int>_> *__p;
  int iVar9;
  int oldPosN;
  int iVar10;
  double dVar11;
  double dVar12;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> tempPosSampledList;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> outputSampledList;
  double local_58;
  double local_48;
  
  peVar1 = (this->posTrainDataList).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar2 = (this->negTrainDataList).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  piVar3 = (peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar4 = (peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar5 = (peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar6 = (peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  UpdateTrainDataList(this,oldNs);
  peVar1 = (this->posTrainDataList).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar2 = (this->negTrainDataList).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  iVar10 = (int)((ulong)((long)(peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  iVar9 = (int)((ulong)((long)(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(peVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  dVar11 = (double)iVar10 / (double)iVar9;
  dVar12 = 1.0 / dVar11;
  if (this->samplingType == DownSamplingMajority) {
    local_48 = 1.0;
    if (dVar11 <= 1.0) {
      local_48 = dVar11;
    }
    local_58 = (double)(~-(ulong)(1.0 <= dVar11) & 0x3ff0000000000000 |
                       (ulong)dVar12 & -(ulong)(1.0 <= dVar11));
  }
  else {
    bVar8 = 1.0 <= dVar11;
    if (dVar11 <= 1.0) {
      dVar11 = 1.0;
    }
    local_58 = (double)(~-(ulong)bVar8 & (ulong)dVar12 | -(ulong)bVar8 & 0x3ff0000000000000);
    local_48 = dVar11;
  }
  __p = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  (__p->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (__p->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (__p->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__shared_ptr<std::vector<int,std::allocator<int>>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::vector<int,std::allocator<int>>,void>
            ((__shared_ptr<std::vector<int,std::allocator<int>>,(__gnu_cxx::_Lock_policy)2> *)
             &outputSampledList,__p);
  oldPosN = (int)((ulong)((long)piVar3 - (long)piVar4) >> 2);
  if (oldPosN < iVar9) {
    tempPosSampledList.
    super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    tempPosSampledList.
    super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    GetPosNewAddedSampledList(this,oldPosN,local_48,&tempPosSampledList);
    pvVar7 = (vector<int,std::allocator<int>> *)
             (this->posSampledList).
             super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              (pvVar7,(const_iterator)*(int **)(pvVar7 + 8),
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               ((tempPosSampledList.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               ((tempPosSampledList.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,std::allocator<int>> *)
               outputSampledList.
               super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,(const_iterator)
                       ((outputSampledList.
                         super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               ((tempPosSampledList.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               ((tempPosSampledList.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&tempPosSampledList.
                super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  iVar9 = (int)((ulong)((long)piVar5 - (long)piVar6) >> 2);
  if (iVar9 < iVar10) {
    tempPosSampledList.
    super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    tempPosSampledList.
    super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    GetNegNewAddedSampledList(this,iVar9,local_58,&tempPosSampledList);
    pvVar7 = (vector<int,std::allocator<int>> *)
             (this->negSampledList).
             super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              (pvVar7,(const_iterator)*(int **)(pvVar7 + 8),
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               ((tempPosSampledList.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               ((tempPosSampledList.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,std::allocator<int>> *)
               outputSampledList.
               super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,(const_iterator)
                       ((outputSampledList.
                         super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               ((tempPosSampledList.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               ((tempPosSampledList.
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&tempPosSampledList.
                super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  std::__shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&o_list->
              super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
             ,&outputSampledList.
               super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&outputSampledList.
              super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void RandomForest::ODTree<T>::MultipleParameterBoostrapSampling(int oldNs, std::shared_ptr<std::vector<int> > *o_list)
{
    int oldPosN=posTrainDataList->size();
    int oldNegN=negTrainDataList->size();
    UpdateTrainDataList(oldNs);
    int newPosN=posTrainDataList->size();
    int newNegN=negTrainDataList->size();

    double imbalanceRatio=static_cast<double>(newNegN)/newPosN;
    double posLambda, negLambda;
    if(samplingType==DownSamplingMajority)
    {
        posLambda=imbalanceRatio>=1.0 ? 1.0:imbalanceRatio;
        negLambda=imbalanceRatio>=1.0 ? 1.0/imbalanceRatio:1.0;
    }
    else{
        posLambda=imbalanceRatio>=1.0 ? imbalanceRatio:1.0;
        negLambda=imbalanceRatio>=1.0 ? 1.0:1.0/imbalanceRatio;
    }
    
    std::shared_ptr<std::vector<int> > outputSampledList(new std::vector<int>);
    if(newPosN>oldPosN)
    {
        std::shared_ptr<std::vector<int> > tempPosSampledList;
        GetPosNewAddedSampledList(oldPosN, posLambda, &tempPosSampledList);
        posSampledList->insert(posSampledList->end(), tempPosSampledList->begin(), tempPosSampledList->end());
        outputSampledList->insert(outputSampledList->end(), tempPosSampledList->begin(), tempPosSampledList->end());
    }
    if(newNegN>oldNegN)
    {
        std::shared_ptr<std::vector<int> > tempNegSampledList;
        GetNegNewAddedSampledList(oldNegN, negLambda, &tempNegSampledList);
        negSampledList->insert(negSampledList->end(), tempNegSampledList->begin(), tempNegSampledList->end());
        outputSampledList->insert(outputSampledList->end(), tempNegSampledList->begin(), tempNegSampledList->end());
    }
    *o_list=outputSampledList;
}